

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O0

archive_write_filter * filter_lookup(archive *_a,int n)

{
  archive_write_filter *f;
  archive_write *a;
  int n_local;
  archive *_a_local;
  archive_write_filter *local_8;
  
  f = (archive_write_filter *)_a[1].error_string.buffer_length;
  if (n == -1) {
    local_8 = (archive_write_filter *)_a[1].current_code;
  }
  else {
    n_local = n;
    if (n < 0) {
      local_8 = (archive_write_filter *)0x0;
    }
    else {
      for (; 0 < n_local && f != (archive_write_filter *)0x0; n_local = n_local + -1) {
        f = f->next_filter;
      }
      local_8 = f;
    }
  }
  return local_8;
}

Assistant:

static struct archive_write_filter *
filter_lookup(struct archive *_a, int n)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct archive_write_filter *f = a->filter_first;
	if (n == -1)
		return a->filter_last;
	if (n < 0)
		return NULL;
	while (n > 0 && f != NULL) {
		f = f->next_filter;
		--n;
	}
	return f;
}